

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_re_and(int n,mpc_val_t **xs)

{
  mpc_parser_t *local_28;
  mpc_parser_t *p;
  int i;
  mpc_val_t **xs_local;
  int n_local;
  
  local_28 = mpc_lift(mpcf_ctor_str);
  for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
    local_28 = mpc_and(2,mpcf_strfold,local_28,xs[p._4_4_],free);
  }
  return local_28;
}

Assistant:

static mpc_val_t *mpcf_re_and(int n, mpc_val_t **xs) {
  int i;
  mpc_parser_t *p = mpc_lift(mpcf_ctor_str);
  for (i = 0; i < n; i++) {
    p = mpc_and(2, mpcf_strfold, p, xs[i], free);
  }
  return p;
}